

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O0

TestPlugin * __thiscall TestPlugin::removePluginByName(TestPlugin *this,SimpleString *name)

{
  bool bVar1;
  SimpleString *in_RDI;
  TestPlugin *removed;
  SimpleString *in_stack_ffffffffffffffd8;
  TestPlugin *local_18;
  
  local_18 = (TestPlugin *)0x0;
  if (in_RDI->bufferSize_ != 0) {
    getName((TestPlugin *)in_RDI->bufferSize_);
    bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffffd8);
    if (bVar1) {
      local_18 = (TestPlugin *)in_RDI->bufferSize_;
      in_RDI->bufferSize_ = *(size_t *)(in_RDI->bufferSize_ + 8);
    }
  }
  return local_18;
}

Assistant:

TestPlugin* TestPlugin::removePluginByName(const SimpleString& name)
{
    TestPlugin* removed = NULLPTR;
    if (next_ && next_->getName() == name) {
        removed = next_;
        next_ = next_->next_;
    }
    return removed;
}